

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall AsyncTCPClient::onRequestComplete(AsyncTCPClient *this,shared_ptr<Session> *session)

{
  iterator __position;
  element_type *peVar1;
  error_code local_48;
  unique_lock<std::mutex> lock;
  error_code ignored_ec;
  
  ignored_ec.val_ = 0;
  ignored_ec.failed_ = false;
  ignored_ec.cat_ =
       (error_category *)boost::system::detail::cat_holder<void>::system_category_instance;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::shutdown((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)(session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,2,
             (int)&ignored_ec);
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_active_sessions_guard);
  local_48.val_ = ((session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_id;
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Session>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Session>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Session>_>_>_>
               ::find(&(this->m_active_sessions)._M_t,&local_48.val_);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_active_sessions)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<int,std::pair<int_const,std::shared_ptr<Session>>,std::_Select1st<std::pair<int_const,std::shared_ptr<Session>>>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<Session>>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::shared_ptr<Session>>,std::_Select1st<std::pair<int_const,std::shared_ptr<Session>>>,std::less<int>,std::allocator<std::pair<int_const,std::shared_ptr<Session>>>>
                        *)&this->m_active_sessions,__position);
  }
  std::unique_lock<std::mutex>::unlock(&lock);
  peVar1 = (session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((peVar1->m_ec).val_ == 0) && (peVar1->m_was_cancelled == true)) {
    local_48 = boost::asio::error::make_error_code(operation_aborted);
    peVar1 = (session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  else {
    local_48 = peVar1->m_ec;
  }
  (*peVar1->m_callback)(peVar1->m_id,&peVar1->m_response,&local_48);
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void onRequestComplete(std::shared_ptr<Session> session)
    {
        // Shutting down the connection. This method may
        // fail in case socket is not connected. We don�t care
        // about the error code if this function fails.
        boost::system::error_code ignored_ec;

        session->m_sock.shutdown( asio::ip::tcp::socket::shutdown_both, ignored_ec);

        // Remove session form the map of active sessions.
        std::unique_lock<std::mutex>
            lock(m_active_sessions_guard);

        auto it = m_active_sessions.find(session->m_id);
        if (it != m_active_sessions.end())
            m_active_sessions.erase(it);

        lock.unlock();

        boost::system::error_code ec;

        if (session->m_ec.value() == 0 && session->m_was_cancelled)
            ec = asio::error::operation_aborted;
        else
            ec = session->m_ec;

        // Call the callback provided by the user.
        session->m_callback(session->m_id,
                            session->m_response, ec);
    }